

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testSpecDowngradeFlexibleShapes(void)

{
  bool bVar1;
  int32_t iVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  Arena *pAVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  ArrayFeatureType_ShapeRange *this;
  SizeRange *this_00;
  NeuralNetwork *this_01;
  NeuralNetworkLayer *this_02;
  ostream *poVar8;
  Model *this_03;
  undefined1 local_f8 [8];
  Model mlmodel;
  undefined1 local_d8 [8];
  Result res;
  UnaryFunctionLayerParams *params;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  ArrayFeatureType *outvec;
  FeatureDescription *out;
  SizeRange *array_shape1_range;
  ArrayFeatureType *array_type;
  FeatureDescription *topIn;
  undefined1 local_60 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_60);
  CoreML::Specification::Model::set_specificationversion((Model *)local_60,3);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_60);
  pFVar4 = CoreML::Specification::ModelDescription::add_input(pMVar3);
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar4->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",pAVar5);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar7 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar7,ArrayFeatureType_ArrayDataType_FLOAT32);
  this = CoreML::Specification::ArrayFeatureType::mutable_shaperange(pAVar7);
  this_00 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(this);
  CoreML::Specification::SizeRange::set_lowerbound(this_00,10);
  CoreML::Specification::SizeRange::set_upperbound(this_00,10);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_60);
  pFVar4 = CoreML::Specification::ModelDescription::add_output(pMVar3);
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar4->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"probs",pAVar5);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar7 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar7,ArrayFeatureType_ArrayDataType_DOUBLE);
  this_01 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_60);
  this_02 = CoreML::Specification::NeuralNetwork::add_layers(this_01);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_02,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_02,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_unary(this_02);
  CoreML::Specification::UnaryFunctionLayerParams::set_type
            ((UnaryFunctionLayerParams *)res.m_message.field_2._8_8_,
             UnaryFunctionLayerParams_Operation_ABS);
  CoreML::validate<(MLModelType)500>((Result *)local_d8,(Model *)local_60);
  bVar1 = CoreML::Result::good((Result *)local_d8);
  if (bVar1) {
    CoreML::Model::Model((Model *)local_f8,(Model *)local_60);
    this_03 = CoreML::Model::getProto((Model *)local_f8);
    iVar2 = CoreML::Specification::Model::specificationversion(this_03);
    if (iVar2 != 3) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1050);
      poVar8 = std::operator<<(poVar8,": error: ");
      poVar8 = std::operator<<(poVar8,
                               "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12"
                              );
      poVar8 = std::operator<<(poVar8," was false, expected true.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    m1._oneof_case_[0]._1_3_ = 0;
    m1._oneof_case_[0]._0_1_ = iVar2 != 3;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    CoreML::Model::~Model((Model *)local_f8);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x104c);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"(res).good()");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  CoreML::Result::~Result((Result *)local_d8);
  CoreML::Specification::Model::~Model((Model *)local_60);
  return m1._oneof_case_[0];
}

Assistant:

int testSpecDowngradeFlexibleShapes() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *array_type = topIn->mutable_type()->mutable_multiarraytype();
    array_type->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *array_shape1_range = array_type->mutable_shaperange()->add_sizeranges();
    array_shape1_range->set_lowerbound(10);
    array_shape1_range->set_upperbound(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");

    auto *params = layer->mutable_unary();
    params->set_type(Specification::UnaryFunctionLayerParams::ABS);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12);

    return 0;

}